

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Input.cxx
# Opt level: O2

void __thiscall Fl_File_Input::draw_buttons(Fl_File_Input *this)

{
  int iVar1;
  int iVar2;
  int Y;
  int X;
  Fl_Boxtype t;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  if (((this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.damage_ & 0x90) != 0) {
    update_buttons(this);
  }
  iVar5 = 0;
  for (uVar6 = 0; iVar2 = (int)this->buttons_[uVar6], this->buttons_[uVar6] != 0; uVar6 = uVar6 + 1)
  {
    iVar4 = (this->super_Fl_Input).super_Fl_Input_.xscroll_;
    iVar3 = (iVar5 + iVar2) - iVar4;
    if (iVar3 != 0 && iVar4 <= iVar5 + iVar2) {
      if (iVar5 < iVar4) {
        t = (Fl_Boxtype)
            ((1 < this->down_box_ && uVar6 == (uint)(int)this->pressed_) | this->down_box_);
        X = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.x_;
        Y = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.y_;
        iVar2 = iVar3;
      }
      else {
        Y = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.y_;
        iVar1 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.w_;
        X = (iVar5 - iVar4) + (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.x_;
        t = (Fl_Boxtype)
            ((1 < this->down_box_ && uVar6 == (uint)(int)this->pressed_) | this->down_box_);
        if (iVar1 < iVar3) {
          iVar2 = (iVar4 - iVar5) + iVar1;
        }
      }
      Fl_Widget::draw_box((Fl_Widget *)this,t,X,Y,iVar2,10,0x31);
    }
    iVar5 = iVar5 + this->buttons_[uVar6];
  }
  iVar2 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.w_;
  iVar4 = iVar2 - iVar5;
  if (iVar4 != 0 && iVar5 <= iVar2) {
    iVar2 = (this->super_Fl_Input).super_Fl_Input_.xscroll_;
    Fl_Widget::draw_box((Fl_Widget *)this,
                        (uint)((1 < this->down_box_ && (long)this->pressed_ == uVar6) |
                              this->down_box_),
                        (iVar5 + (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.x_) - iVar2,
                        (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.y_,iVar4 + iVar2,10,
                        0x31);
  }
  return;
}

Assistant:

void Fl_File_Input::draw_buttons() {
  int	i,					// Looping var
	X;					// Current X position


  if (damage() & (FL_DAMAGE_BAR | FL_DAMAGE_ALL)) {
    update_buttons();
  }

  for (X = 0, i = 0; buttons_[i]; i ++)
  {
    if ((X + buttons_[i]) > xscroll()) {
      if (X < xscroll()) {
        draw_box(pressed_ == i ? fl_down(down_box()) : down_box(),
                 x(), y(), X + buttons_[i] - xscroll(), DIR_HEIGHT, FL_GRAY);
      } else if ((X + buttons_[i] - xscroll()) > w()) {
	draw_box(pressed_ == i ? fl_down(down_box()) : down_box(),
        	 x() + X - xscroll(), y(), w() - X + xscroll(), DIR_HEIGHT,
		 FL_GRAY);
      } else {
        draw_box(pressed_ == i ? fl_down(down_box()) : down_box(),
	         x() + X - xscroll(), y(), buttons_[i], DIR_HEIGHT, FL_GRAY);
      }
    }

    X += buttons_[i];
  }

  if (X < w()) {
    draw_box(pressed_ == i ? fl_down(down_box()) : down_box(),
             x() + X - xscroll(), y(), w() - X + xscroll(), DIR_HEIGHT, FL_GRAY);
  }
}